

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

int __thiscall GF2::VFunc<7UL,_8UL>::Deg(VFunc<7UL,_8UL> *this)

{
  int iVar1;
  int iVar2;
  size_t pos;
  size_t pos_00;
  BFunc<7UL> bf;
  
  BFunc<7UL>::BFunc(&bf,false);
  iVar2 = -1;
  for (pos_00 = 0; pos_00 != 8; pos_00 = pos_00 + 1) {
    GetCoord(this,pos_00,&bf);
    iVar1 = BFunc<7UL>::Deg(&bf);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Deg() const
	{	
		BFunc<_n> bf;
		int record = -1, deg;
		for (size_t pos = 0; pos < _m; pos++)
		{
			GetCoord(pos, bf);
			if ((deg = bf.Deg()) > record)
				record = deg;
		}
		return record;
	}